

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::ShaderRenderCaseInstance
          (ShaderRenderCaseInstance *this,Context *context,bool isVertexCase,
          ShaderEvaluator *evaluator,UniformSetup *uniformSetup,AttributeSetupFunc attribFunc,
          ImageBackingMode imageBackingMode,deUint32 gridSize)

{
  SparseContext *pSVar1;
  Allocator *pAVar2;
  deUint32 local_5c;
  allocator<char> local_47;
  allocator<char> local_46;
  DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext> local_45 [13];
  AttributeSetupFunc local_38;
  AttributeSetupFunc attribFunc_local;
  UniformSetup *uniformSetup_local;
  ShaderEvaluator *evaluator_local;
  Context *pCStack_18;
  bool isVertexCase_local;
  Context *context_local;
  ShaderRenderCaseInstance *this_local;
  
  local_38 = attribFunc;
  attribFunc_local = (AttributeSetupFunc)uniformSetup;
  uniformSetup_local = (UniformSetup *)evaluator;
  evaluator_local._7_1_ = isVertexCase;
  pCStack_18 = context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_016a9a48;
  this->m_imageBackingMode = imageBackingMode;
  if (gridSize == 0) {
    local_5c = 4;
    if ((evaluator_local._7_1_ & 1) != 0) {
      local_5c = 0x5a;
    }
  }
  else {
    local_5c = gridSize;
  }
  this->m_quadGridSize = local_5c;
  pSVar1 = createSparseContext(this);
  de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>::DefaultDeleter(local_45);
  de::details::
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  ::UniquePtr(&this->m_sparseContext,pSVar1);
  pAVar2 = getAllocator(this);
  this->m_memAlloc = pAVar2;
  tcu::Vector<float,_4>::Vector
            (&this->m_clearColor,(Vector<float,_4> *)sr::(anonymous_namespace)::DEFAULT_CLEAR_COLOR)
  ;
  this->m_isVertexCase = (bool)(evaluator_local._7_1_ & 1);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&this->m_userAttribTransforms);
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::vector(&this->m_textures);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_vertexShaderName,"vert",&local_46);
  std::allocator<char>::~allocator(&local_46);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_fragmentShaderName,"frag",&local_47);
  std::allocator<char>::~allocator(&local_47);
  tcu::Vector<unsigned_int,_2>::Vector(&this->m_renderSize,0x80,0x80);
  this->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_evaluator = (ShaderEvaluator *)uniformSetup_local;
  this->m_uniformSetup = (UniformSetup *)attribFunc_local;
  this->m_attribFunc = local_38;
  de::details::MovePtr<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::MovePtr
            (&this->m_quadGrid);
  tcu::TextureLevel::TextureLevel(&this->m_resultImage);
  std::
  vector<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
  ::vector(&this->m_enabledBaseAttributes);
  de::details::
  MovePtr<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>::
  MovePtr(&this->m_descriptorSetLayoutBuilder);
  de::details::MovePtr<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>::
  MovePtr(&this->m_descriptorPoolBuilder);
  de::details::
  MovePtr<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>::
  MovePtr(&this->m_descriptorSetUpdateBuilder);
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>_>_>
  ::vector(&this->m_uniformInfos);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  vector(&this->m_allocations);
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::vector(&this->m_vertexBindingDescription);
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::vector(&this->m_vertexAttributeDescription);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::vector(&this->m_vertexBuffers);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  vector(&this->m_vertexBufferAllocs);
  this->m_sampleCount = VK_SAMPLE_COUNT_1_BIT;
  std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::vector
            (&this->m_pushConstantRanges);
  return;
}

Assistant:

ShaderRenderCaseInstance::ShaderRenderCaseInstance (Context&					context,
													const bool					isVertexCase,
													const ShaderEvaluator*		evaluator,
													const UniformSetup*			uniformSetup,
													const AttributeSetupFunc	attribFunc,
													const ImageBackingMode		imageBackingMode,
													const deUint32				gridSize)
	: vkt::TestInstance		(context)
	, m_imageBackingMode	(imageBackingMode)
	, m_quadGridSize		(gridSize == static_cast<deUint32>(GRID_SIZE_DEFAULTS)
							 ? (isVertexCase
								? static_cast<deUint32>(GRID_SIZE_DEFAULT_VERTEX)
								: static_cast<deUint32>(GRID_SIZE_DEFAULT_FRAGMENT))
							 : gridSize)
	, m_sparseContext		(createSparseContext())
	, m_memAlloc			(getAllocator())
	, m_clearColor			(DEFAULT_CLEAR_COLOR)
	, m_isVertexCase		(isVertexCase)
	, m_vertexShaderName	("vert")
	, m_fragmentShaderName	("frag")
	, m_renderSize			(MAX_RENDER_WIDTH, MAX_RENDER_HEIGHT)
	, m_colorFormat			(VK_FORMAT_R8G8B8A8_UNORM)
	, m_evaluator			(evaluator)
	, m_uniformSetup		(uniformSetup)
	, m_attribFunc			(attribFunc)
	, m_sampleCount			(VK_SAMPLE_COUNT_1_BIT)
{
}